

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeComparison.cxx
# Opt level: O2

bool __thiscall
cmFileTimeComparison::FileTimeCompare(cmFileTimeComparison *this,char *f1,char *f2,int *result)

{
  bool bVar1;
  
  bVar1 = cmFileTimeComparisonInternal::FileTimeCompare(this->Internals,f1,f2,result);
  return bVar1;
}

Assistant:

bool cmFileTimeComparison::FileTimeCompare(const char* f1, const char* f2,
                                           int* result)
{
  return this->Internals->FileTimeCompare(f1, f2, result);
}